

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleString_copyInBufferNormal_Test::~TEST_SimpleString_copyInBufferNormal_Test
          (TEST_SimpleString_copyInBufferNormal_Test *this)

{
  TEST_SimpleString_copyInBufferNormal_Test *this_local;
  
  ~TEST_SimpleString_copyInBufferNormal_Test(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(SimpleString, copyInBufferNormal)
{
    SimpleString str("Hello World");
    size_t bufferSize = str.size()+1;
    char* buffer = (char*) PlatformSpecificMalloc(bufferSize);
    str.copyToBuffer(buffer, bufferSize);
    STRCMP_EQUAL(str.asCharString(), buffer);
    PlatformSpecificFree(buffer);
}